

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ptlsbench.c
# Opt level: O0

int bench_basic(uint64_t *x)

{
  uint uVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  undefined4 local_24;
  uint32_t v;
  uint i;
  uint32_t b;
  uint32_t a;
  uint64_t t_start;
  uint64_t *x_local;
  
  uVar2 = bench_time();
  v = (uint32_t)(*x >> 0x20);
  i = (uint)*x;
  for (local_24 = 0; local_24 < 10000000; local_24 = local_24 + 1) {
    uVar1 = v ^ i + (i >> 3 | i << 0x1d);
    v = i;
    i = uVar1;
  }
  *x = CONCAT44(v,i);
  uVar3 = bench_time();
  return (int)uVar3 - (int)uVar2;
}

Assistant:

static int bench_basic(uint64_t *x)
{
    uint64_t t_start = bench_time();
    uint32_t a = (uint32_t)((*x)&0xFFFFFFFF);
    uint32_t b = (uint32_t)((*x)>>32);

    /* Evaluate the current CPU. The benchmark is designed to 
     * emulate typical encryption operations, hopefully so it
     * will not be compiled out by the optimizer. */
    for (unsigned int i = 0; i < 10000000; i++) {
        uint32_t v = (a >> 3)|(a << 29);
        v += a;
        v ^= b;
        b = a;
        a = v;
    }
    *x = (((uint64_t) b)<<32)|a;

    return (int)(bench_time() - t_start);
}